

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O2

int __thiscall
jrtplib::
RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
::GotoElement(RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
              *this,in6_addr *k)

{
  HashElement *pHVar1;
  bool bVar2;
  int iVar3;
  HashElement **ppHVar4;
  
  iVar3 = RTPUDPv6Trans_GetHashIndex_in6_addr::GetIndex(k);
  if (iVar3 < 0x207d) {
    ppHVar4 = this->table + iVar3;
    iVar3 = -10;
    while( true ) {
      pHVar1 = *ppHVar4;
      this->curhashelem = pHVar1;
      if (pHVar1 == (HashElement *)0x0) break;
      bVar2 = operator==(&pHVar1->key,k);
      if (bVar2) {
        return 0;
      }
      ppHVar4 = &this->curhashelem->hashnext;
    }
  }
  else {
    iVar3 = -8;
  }
  return iVar3;
}

Assistant:

inline int RTPKeyHashTable<Key,Element,GetIndex,hashsize>::GotoElement(const Key &k)
{
	int index;
	bool found;
	
	index = GetIndex::GetIndex(k);
	if (index >= hashsize)
		return ERR_RTP_KEYHASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	curhashelem = table[index]; 
	found = false;
	while(!found && curhashelem != 0)
	{
		if (curhashelem->GetKey() == k)
			found = true;
		else
			curhashelem = curhashelem->hashnext;
	}
	if (!found)
		return ERR_RTP_KEYHASHTABLE_KEYNOTFOUND;
	return 0;
}